

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

void __thiscall
RuntimeInterface::GetInstanceExtensionProperties
          (RuntimeInterface *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          *extension_properties)

{
  uint32_t uVar1;
  bool bVar2;
  undefined4 uVar3;
  pointer this_00;
  int iVar4;
  XrExtensionProperties *pXVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  ulong local_110;
  size_t prop;
  ulong uStack_100;
  bool found;
  size_t ext;
  size_t props_count;
  size_t ext_count;
  XrExtensionProperties example_properties;
  uint32_t count_output;
  uint32_t count;
  PFN_xrVoidFunction local_38;
  PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> runtime_extension_properties
  ;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *extension_properties_local;
  RuntimeInterface *this_local;
  
  runtime_extension_properties.
  super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)extension_properties;
  std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::vector
            ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
             &rt_xrEnumerateInstanceExtensionProperties);
  (*this->_get_instance_proc_addr)
            ((XrInstance)0x0,"xrEnumerateInstanceExtensionProperties",&local_38);
  example_properties._148_4_ = 0;
  (*local_38)(0,0,&example_properties.field_0x94);
  if (example_properties._148_4_ != 0) {
    example_properties.extensionName[0x68] = '\0';
    example_properties.extensionName[0x69] = '\0';
    example_properties.extensionName[0x6a] = '\0';
    example_properties.extensionName[0x6b] = '\0';
    example_properties.extensionName[0x6c] = '\0';
    example_properties.extensionName[0x6d] = '\0';
    example_properties.extensionName[0x6e] = '\0';
    example_properties.extensionName[0x6f] = '\0';
    example_properties.extensionName[0x70] = '\0';
    example_properties.extensionName[0x71] = '\0';
    example_properties.extensionName[0x72] = '\0';
    example_properties.extensionName[0x73] = '\0';
    example_properties.extensionName[0x74] = '\0';
    example_properties.extensionName[0x75] = '\0';
    example_properties.extensionName[0x76] = '\0';
    example_properties.extensionName[0x77] = '\0';
    example_properties.extensionName[0x58] = '\0';
    example_properties.extensionName[0x59] = '\0';
    example_properties.extensionName[0x5a] = '\0';
    example_properties.extensionName[0x5b] = '\0';
    example_properties.extensionName[0x5c] = '\0';
    example_properties.extensionName[0x5d] = '\0';
    example_properties.extensionName[0x5e] = '\0';
    example_properties.extensionName[0x5f] = '\0';
    example_properties.extensionName[0x60] = '\0';
    example_properties.extensionName[0x61] = '\0';
    example_properties.extensionName[0x62] = '\0';
    example_properties.extensionName[99] = '\0';
    example_properties.extensionName[100] = '\0';
    example_properties.extensionName[0x65] = '\0';
    example_properties.extensionName[0x66] = '\0';
    example_properties.extensionName[0x67] = '\0';
    example_properties.extensionName[0x48] = '\0';
    example_properties.extensionName[0x49] = '\0';
    example_properties.extensionName[0x4a] = '\0';
    example_properties.extensionName[0x4b] = '\0';
    example_properties.extensionName[0x4c] = '\0';
    example_properties.extensionName[0x4d] = '\0';
    example_properties.extensionName[0x4e] = '\0';
    example_properties.extensionName[0x4f] = '\0';
    example_properties.extensionName[0x50] = '\0';
    example_properties.extensionName[0x51] = '\0';
    example_properties.extensionName[0x52] = '\0';
    example_properties.extensionName[0x53] = '\0';
    example_properties.extensionName[0x54] = '\0';
    example_properties.extensionName[0x55] = '\0';
    example_properties.extensionName[0x56] = '\0';
    example_properties.extensionName[0x57] = '\0';
    example_properties.extensionName[0x38] = '\0';
    example_properties.extensionName[0x39] = '\0';
    example_properties.extensionName[0x3a] = '\0';
    example_properties.extensionName[0x3b] = '\0';
    example_properties.extensionName[0x3c] = '\0';
    example_properties.extensionName[0x3d] = '\0';
    example_properties.extensionName[0x3e] = '\0';
    example_properties.extensionName[0x3f] = '\0';
    example_properties.extensionName[0x40] = '\0';
    example_properties.extensionName[0x41] = '\0';
    example_properties.extensionName[0x42] = '\0';
    example_properties.extensionName[0x43] = '\0';
    example_properties.extensionName[0x44] = '\0';
    example_properties.extensionName[0x45] = '\0';
    example_properties.extensionName[0x46] = '\0';
    example_properties.extensionName[0x47] = '\0';
    example_properties.extensionName[0x28] = '\0';
    example_properties.extensionName[0x29] = '\0';
    example_properties.extensionName[0x2a] = '\0';
    example_properties.extensionName[0x2b] = '\0';
    example_properties.extensionName[0x2c] = '\0';
    example_properties.extensionName[0x2d] = '\0';
    example_properties.extensionName[0x2e] = '\0';
    example_properties.extensionName[0x2f] = '\0';
    example_properties.extensionName[0x30] = '\0';
    example_properties.extensionName[0x31] = '\0';
    example_properties.extensionName[0x32] = '\0';
    example_properties.extensionName[0x33] = '\0';
    example_properties.extensionName[0x34] = '\0';
    example_properties.extensionName[0x35] = '\0';
    example_properties.extensionName[0x36] = '\0';
    example_properties.extensionName[0x37] = '\0';
    example_properties.extensionName[0x18] = '\0';
    example_properties.extensionName[0x19] = '\0';
    example_properties.extensionName[0x1a] = '\0';
    example_properties.extensionName[0x1b] = '\0';
    example_properties.extensionName[0x1c] = '\0';
    example_properties.extensionName[0x1d] = '\0';
    example_properties.extensionName[0x1e] = '\0';
    example_properties.extensionName[0x1f] = '\0';
    example_properties.extensionName[0x20] = '\0';
    example_properties.extensionName[0x21] = '\0';
    example_properties.extensionName[0x22] = '\0';
    example_properties.extensionName[0x23] = '\0';
    example_properties.extensionName[0x24] = '\0';
    example_properties.extensionName[0x25] = '\0';
    example_properties.extensionName[0x26] = '\0';
    example_properties.extensionName[0x27] = '\0';
    example_properties.extensionName[8] = '\0';
    example_properties.extensionName[9] = '\0';
    example_properties.extensionName[10] = '\0';
    example_properties.extensionName[0xb] = '\0';
    example_properties.extensionName[0xc] = '\0';
    example_properties.extensionName[0xd] = '\0';
    example_properties.extensionName[0xe] = '\0';
    example_properties.extensionName[0xf] = '\0';
    example_properties.extensionName[0x10] = '\0';
    example_properties.extensionName[0x11] = '\0';
    example_properties.extensionName[0x12] = '\0';
    example_properties.extensionName[0x13] = '\0';
    example_properties.extensionName[0x14] = '\0';
    example_properties.extensionName[0x15] = '\0';
    example_properties.extensionName[0x16] = '\0';
    example_properties.extensionName[0x17] = '\0';
    example_properties.next = (void *)0x0;
    example_properties.extensionName[0] = '\0';
    example_properties.extensionName[1] = '\0';
    example_properties.extensionName[2] = '\0';
    example_properties.extensionName[3] = '\0';
    example_properties.extensionName[4] = '\0';
    example_properties.extensionName[5] = '\0';
    example_properties.extensionName[6] = '\0';
    example_properties.extensionName[7] = '\0';
    example_properties.type = XR_TYPE_UNKNOWN;
    example_properties._4_4_ = 0;
    example_properties.extensionName[0x78] = '\0';
    example_properties.extensionName[0x79] = '\0';
    example_properties.extensionName[0x7a] = '\0';
    example_properties.extensionName[0x7b] = '\0';
    example_properties.extensionName[0x7c] = '\0';
    example_properties.extensionName[0x7d] = '\0';
    example_properties.extensionName[0x7e] = '\0';
    example_properties.extensionName[0x7f] = '\0';
    ext_count = 2;
    std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::resize
              ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
               &rt_xrEnumerateInstanceExtensionProperties,(ulong)(uint)example_properties._148_4_,
               (value_type *)&ext_count);
    uVar3 = example_properties._148_4_;
    pXVar5 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::data
                       ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                        &rt_xrEnumerateInstanceExtensionProperties);
    (*local_38)(0,(ulong)(uint)uVar3,&example_properties.field_0x94,pXVar5);
  }
  sVar6 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::size
                    ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                     &rt_xrEnumerateInstanceExtensionProperties);
  sVar7 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::size
                    ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                     runtime_extension_properties.
                     super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uStack_100 = 0;
  do {
    if (sVar6 <= uStack_100) {
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::~vector
                ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                 &rt_xrEnumerateInstanceExtensionProperties);
      return;
    }
    bVar2 = false;
    for (local_110 = 0; local_110 < sVar7; local_110 = local_110 + 1) {
      pvVar8 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
               operator[]((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                          runtime_extension_properties.
                          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
      pvVar9 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
               operator[]((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                          &rt_xrEnumerateInstanceExtensionProperties,uStack_100);
      iVar4 = strcmp(pvVar8->extensionName,pvVar9->extensionName);
      if (iVar4 == 0) {
        pvVar8 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
                 operator[]((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *
                            )&rt_xrEnumerateInstanceExtensionProperties,uStack_100);
        uVar1 = pvVar8->extensionVersion;
        pvVar8 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
                 operator[]((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *
                            )runtime_extension_properties.
                             super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
        pvVar8->extensionVersion = uVar1;
        bVar2 = true;
        break;
      }
    }
    this_00 = runtime_extension_properties.
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
      pvVar8 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
               operator[]((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                          &rt_xrEnumerateInstanceExtensionProperties,uStack_100);
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::push_back
                ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)this_00,
                 pvVar8);
    }
    uStack_100 = uStack_100 + 1;
  } while( true );
}

Assistant:

void RuntimeInterface::GetInstanceExtensionProperties(std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<XrExtensionProperties> runtime_extension_properties;
    PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrEnumerateInstanceExtensionProperties",
                            reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrEnumerateInstanceExtensionProperties));
    uint32_t count = 0;
    uint32_t count_output = 0;
    // Get the count from the runtime
    rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, nullptr);
    if (count_output > 0) {
        XrExtensionProperties example_properties{};
        example_properties.type = XR_TYPE_EXTENSION_PROPERTIES;
        runtime_extension_properties.resize(count_output, example_properties);
        count = count_output;
        rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, runtime_extension_properties.data());
    }
    size_t ext_count = runtime_extension_properties.size();
    size_t props_count = extension_properties.size();
    for (size_t ext = 0; ext < ext_count; ++ext) {
        bool found = false;
        for (size_t prop = 0; prop < props_count; ++prop) {
            // If we find it, then make sure the spec version matches that of the runtime instead of the
            // layer.
            if (strcmp(extension_properties[prop].extensionName, runtime_extension_properties[ext].extensionName) == 0) {
                // Make sure the spec version used is the runtime's
                extension_properties[prop].extensionVersion = runtime_extension_properties[ext].extensionVersion;
                found = true;
                break;
            }
        }
        if (!found) {
            extension_properties.push_back(runtime_extension_properties[ext]);
        }
    }
}